

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

void __thiscall
QWidgetResizeHandler::QWidgetResizeHandler(QWidgetResizeHandler *this,QWidget *parent,QWidget *cw)

{
  int iVar1;
  QFrame *pQVar2;
  int *piVar3;
  QObject *in_RDX;
  QObject *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QFrame *frame;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QObject *local_48;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d194b0;
  *(QObject **)(in_RDI + 0x10) = in_RSI;
  local_48 = in_RSI;
  if (in_RDX != (QObject *)0x0) {
    local_48 = in_RDX;
  }
  *(QObject **)(in_RDI + 0x18) = local_48;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  in_RDI[0x40] = (QObject)((byte)in_RDI[0x40] & 0xfe);
  in_RDI[0x40] = (QObject)((byte)in_RDI[0x40] & 0xfd);
  *(undefined4 *)(in_RDI + 0x30) = 0;
  QWidget::setMouseTracking
            ((QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (bool)in_stack_ffffffffffffffaf);
  pQVar2 = qobject_cast<QFrame*>((QObject *)0x6689f3);
  if (pQVar2 == (QFrame *)0x0) {
    iVar1 = 4;
  }
  else {
    iVar1 = QFrame::frameWidth((QFrame *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  *(int *)(in_RDI + 0x3c) = iVar1;
  local_c = 4;
  piVar3 = qMax<int>(&local_c,(int *)(in_RDI + 0x3c));
  *(int *)(in_RDI + 0x3c) = *piVar3;
  in_RDI[0x40] = (QObject)((byte)in_RDI[0x40] | 4);
  QObject::installEventFilter(*(QObject **)(in_RDI + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWidgetResizeHandler::QWidgetResizeHandler(QWidget *parent, QWidget *cw)
    : QObject(parent), widget(parent), childWidget(cw ? cw : parent),
      fw(0), extrahei(0), buttonDown(false), active(false)
{
    mode = Nowhere;
    widget->setMouseTracking(true);
    QFrame *frame = qobject_cast<QFrame*>(widget);
    range = frame ? frame->frameWidth() : RANGE;
    range = qMax(RANGE, range);
    enabled = true;
    widget->installEventFilter(this);
}